

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O1

void readStartOfFrame(ifstream *inFile,Header *header)

{
  ColorComponent *pCVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined8 in_RAX;
  uint uVar12;
  long lVar13;
  uint uVar14;
  char *pcVar15;
  ostream *poVar16;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading SOF Marker \n",0x14);
  if (header->numComponents == '\0') {
    iVar7 = std::istream::get();
    iVar8 = std::istream::get();
    cVar3 = std::istream::get();
    if (cVar3 != '\b') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"invalid precision :",0x13);
      uStack_38._0_3_ = CONCAT12(cVar3,(undefined2)uStack_38);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)((long)&uStack_38 + 2),1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      goto LAB_00103264;
    }
    iVar9 = std::istream::get();
    iVar10 = std::istream::get();
    header->height = iVar10 + iVar9 * 0x100;
    iVar9 = std::istream::get();
    iVar10 = std::istream::get();
    uVar12 = iVar9 * 0x100 + iVar10;
    header->width = uVar12;
    uVar14 = header->height + 7 >> 3;
    header->mcuHeight = uVar14;
    uVar11 = iVar10 + iVar9 * 0x100 + 7U >> 3;
    header->mcuWidth = uVar11;
    header->mcuHeightReal = uVar14;
    header->mcuWidthReal = uVar11;
    if (uVar12 == 0 || header->height == 0) {
      pcVar15 = "zero width or height\n";
LAB_00103331:
      poVar16 = (ostream *)&std::cout;
      lVar13 = 0x15;
    }
    else {
      bVar4 = std::istream::get();
      header->numComponents = bVar4;
      if (bVar4 == '\0') {
        poVar16 = (ostream *)&std::cout;
        pcVar15 = "number of color components must not be zero";
        lVar13 = 0x2b;
      }
      else if (bVar4 == '\x04') {
        poVar16 = (ostream *)&std::cout;
        pcVar15 = "not support CMYK color mode";
        lVar13 = 0x1b;
      }
      else {
        if (header->numComponents == '\0') {
          return;
        }
        uStack_38 = CONCAT44(8 - (iVar7 * 0x100 + iVar8),(undefined4)uStack_38);
        uVar11 = 0;
        while( true ) {
          cVar3 = std::istream::get();
          if (cVar3 == '\0') {
            header->zeroBased = true;
          }
          bVar5 = cVar3 + header->zeroBased;
          if (bVar5 - 4 < 0xfffffffd) break;
          if (header->colorComponent[bVar5 - 1].used == true) {
            pcVar15 = "used color components";
            goto LAB_00103331;
          }
          pCVar1 = header->colorComponent + (bVar5 - 1);
          pCVar1->used = true;
          bVar6 = std::istream::get();
          pCVar1->horizontalSamplingFactor = bVar6 >> 4;
          pCVar1->verticalSamplingFactor = bVar6 & 0xf;
          bVar6 = std::istream::get();
          pCVar1->quantizationTableID = bVar6;
          bVar4 = pCVar1->horizontalSamplingFactor;
          if (bVar5 == 1) {
            if (bVar4 != '\x01') {
              if ((bVar4 != '\x02') && (1 < (byte)(pCVar1->verticalSamplingFactor - 1)))
              goto LAB_0010350c;
              if ((bVar4 == '\x02') && ((header->mcuWidth & 1) != 0)) {
                header->mcuWidthReal = header->mcuWidthReal + 1;
              }
            }
            bVar2 = pCVar1->verticalSamplingFactor;
            if ((bVar2 == '\x02') && ((header->mcuHeight & 1) != 0)) {
              header->verticalSamplingFactor = header->verticalSamplingFactor + '\x01';
            }
            header->horizontalSamplingFactor = bVar4;
            header->verticalSamplingFactor = bVar2;
          }
          else if ((bVar4 != '\x01') || (pCVar1->verticalSamplingFactor != '\x01')) {
LAB_0010350c:
            poVar16 = (ostream *)&std::cout;
            pcVar15 = "only support samplingFacotor that is 1";
            lVar13 = 0x26;
            goto LAB_0010325f;
          }
          if (3 < bVar6) {
            poVar16 = (ostream *)&std::cout;
            pcVar15 = "not valid quantization talbe id";
            lVar13 = 0x1f;
            goto LAB_0010325f;
          }
          if ((uint)header->numComponents + (uint)header->numComponents * 2 + uStack_38._4_4_ != 0)
          {
            pcVar15 = "not consistent length";
            goto LAB_00103331;
          }
          uVar11 = uVar11 + 1;
          if (header->numComponents <= uVar11) {
            return;
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"not supported componentID:",0x1a);
        poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        pcVar15 = (char *)((long)&uStack_38 + 3);
        uStack_38._0_4_ = CONCAT13(10,(undefined3)uStack_38);
        lVar13 = 1;
      }
    }
  }
  else {
    poVar16 = (ostream *)&std::cout;
    pcVar15 = "Error mutiple SOFs\n";
    lVar13 = 0x13;
  }
LAB_0010325f:
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar15,lVar13);
LAB_00103264:
  header->valid = false;
  return;
}

Assistant:

void readStartOfFrame(std::ifstream& inFile, Header* const header) {
	std::cout << "Reading SOF Marker \n";
	//there can be only one SOF marker per JPEG file
	
	if (header->numComponents != 0) {
		std::cout << "Error mutiple SOFs\n";
		header->valid = false;
		return;
	}

	uint length = (inFile.get() << 8) + inFile.get();
	byte precision = inFile.get();

	//只支持8位的数据
	if (precision != 8) {
		std::cout << "invalid precision :" << precision << std::endl;
		header->valid = false;
		return;
	}

	header->height = (inFile.get() << 8) + inFile.get();
	header->width = (inFile.get() << 8) + inFile.get();

	header->mcuHeight = (header->height + 7) / 8;
	header->mcuWidth = (header->width + 7) / 8;

	header->mcuHeightReal = header->mcuHeight;
	header->mcuWidthReal = header->mcuWidth;

	if (header->height == 0 || header->width == 0) {
		std::cout << "zero width or height\n";
		header->valid = false;
		return;
	}
	
	header->numComponents = inFile.get();
	if (header->numComponents == 4) {
		std::cout << "not support CMYK color mode";
		header->valid = false;
		return;
	}

	if (header->numComponents == 0) {
		std::cout << "number of color components must not be zero";
		header->valid = false;
		return;
	}

	for (uint i = 0; i < header->numComponents; i++) {
		byte componentID = inFile.get();
		/*
			usually 1 2 3, but 0 1 2 is possible ,always force them into 1 2 3
			Y(1), 2(Cb), 3(Cr)
		*/
		if (componentID == 0) {
			header->zeroBased = true;
		}

		if (header->zeroBased) {
			componentID += 1;
		}

		if (componentID == 0 || componentID > 3) {
			std::cout << "not supported componentID:" << (uint)componentID << '\n';
			header->valid = false;
			return;
		}

		ColorComponent* component = &(header->colorComponent[componentID - 1]);
		if (component->used) {
			std::cout << "used color components";
			header->valid = false;
			return;
		}

		component->used = true;
		byte samplingFactor = inFile.get();
		component->horizontalSamplingFactor = samplingFactor >> 4;
		component->verticalSamplingFactor = samplingFactor & 0x0F;
		component->quantizationTableID = inFile.get();

		//lunimance channel
		//只支持1 或者 2
		//horizontal 2的话 代表读取y0 y1, cb cr
		//如果vertical 也2的话, 代表读取 y0 y1 y2 y3 cb cr
		if	(componentID == 1) {

			if (component->horizontalSamplingFactor != 1 && component->verticalSamplingFactor != 2 &&component->verticalSamplingFactor != 1 && component->horizontalSamplingFactor != 2) {
				std::cout << "only support samplingFacotor that is 1";
				header->valid = false;
				return;
			}

			if(component->horizontalSamplingFactor == 2 && header->mcuWidth % 2 == 1) {
				header->mcuWidthReal++;
			}

			if(component->verticalSamplingFactor == 2 && header->mcuHeight % 2 == 1) {
				header->verticalSamplingFactor++;
			}

			header->horizontalSamplingFactor = component->horizontalSamplingFactor;
			header->verticalSamplingFactor = component->verticalSamplingFactor;
		} else { 
			//cb cr在一个mcu中永远是一个
			if (component->horizontalSamplingFactor != 1 || component->verticalSamplingFactor != 1) {
				std::cout << "only support samplingFacotor that is 1";
				header->valid = false;
				return;
			}
		}


		if (component->quantizationTableID > 3) {
			std::cout << "not valid quantization talbe id";
			header->valid = false;
			return;
		}
		//8是length2byte 加上 1byte sample precision 2bytes的 height 2 bytes的width  1byte的components                
		if (length - 8 - (3 * header->numComponents) != 0) {
			std::cout << "not consistent length";
			header->valid = false;
			return;
		}
	}
}